

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O1

void __thiscall bitfoot::Bitfoot::Evaluate(Bitfoot *this)

{
  int iVar1;
  ulong uVar2;
  uint64_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_type sVar9;
  char *__function;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  
  uVar26 = this->state;
  if ((uVar26 & 0x20) != 0) {
    __assert_fail("!(state & Draw)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0x6eb,"void bitfoot::Bitfoot::Evaluate()");
  }
  memset(this->pinfo,0,0x130);
  this->atkCount[0] = 0;
  this->atkCount[1] = 0;
  this->atkScore[0] = 0;
  this->atkScore[1] = 0;
  iVar7 = -_tempo;
  if ((uVar26 & 1) == 0) {
    iVar7 = _tempo;
  }
  iVar8 = this->material[0];
  iVar27 = this->material[1];
  iVar19 = this->sqrVal[0];
  iVar1 = this->sqrVal[1];
  iVar4 = GetPins<true>(this,6);
  iVar5 = GetPins<false>(this,6);
  if (this->pc[2] == 0) {
    iVar6 = -0x32;
  }
  else {
    iVar6 = PawnEval<false>(this);
  }
  iVar6 = ((iVar19 + iVar4 + iVar7 + iVar8) - (iVar27 + iVar1 + iVar5)) + iVar6;
  if (this->pc[3] == 0) {
    iVar6 = iVar6 + 0x32;
  }
  else {
    iVar7 = PawnEval<true>(this);
    iVar6 = iVar6 - iVar7;
  }
  if (this->pc[4] != 0) {
    iVar7 = KnightEval<false>(this);
    iVar6 = iVar6 + iVar7;
  }
  if (this->pc[5] != 0) {
    iVar7 = KnightEval<true>(this);
    iVar6 = iVar6 - iVar7;
  }
  if (this->pc[6] != 0) {
    iVar7 = BishopEval<false>(this);
    iVar6 = iVar6 + iVar7;
  }
  if (this->pc[7] != 0) {
    iVar7 = BishopEval<true>(this);
    iVar6 = iVar6 - iVar7;
  }
  if (this->pc[8] != 0) {
    iVar7 = RookEval<false>(this);
    iVar6 = iVar6 + iVar7;
  }
  if (this->pc[9] != 0) {
    iVar7 = RookEval<true>(this);
    iVar6 = iVar6 - iVar7;
  }
  if (this->pc[10] != 0) {
    iVar7 = QueenEval<false>(this);
    iVar6 = iVar6 + iVar7;
  }
  if (this->pc[0xb] != 0) {
    iVar7 = QueenEval<true>(this);
    iVar6 = iVar6 - iVar7;
  }
  uVar13 = this->atks[5];
  this->atks[0] = this->atks[4] | this->atks[2] | this->atks[6] | this->atks[8] | this->atks[10];
  this->atks[1] = uVar13 | this->atks[3] | this->atks[7] | this->atks[9] | this->atks[0xb];
  iVar7 = KingEval<false>(this);
  iVar8 = KingEval<true>(this);
  iVar8 = (iVar7 + iVar6) - iVar8;
  uVar13 = (&_KING_ATK)[this->king[0]];
  this->atks[0xc] = uVar13;
  uVar24 = (&_KING_ATK)[this->king[1]];
  this->atks[0xd] = uVar24;
  uVar12 = this->atks[3];
  this->atks[0] =
       this->atks[2] | this->atks[4] | this->atks[6] | this->atks[8] | this->atks[10] | uVar13;
  this->atks[1] = uVar12 | this->atks[5] | this->atks[7] | this->atks[9] | this->atks[0xb] | uVar24;
  if (this->pinfo[0].passed != 0) {
    iVar7 = PasserEval<false>(this);
    iVar8 = iVar7 + iVar8;
  }
  if (this->pinfo[1].passed != 0) {
    iVar7 = PasserEval<true>(this);
    iVar8 = iVar8 - iVar7;
  }
  VerifyPosition(this);
  if ((((this->state & 0x20) != 0) || (99 < this->rcount)) ||
     (sVar9 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    _seen,&this->positionKey), sVar9 != 0)) {
LAB_0010a783:
    uVar26 = this->state;
    this->state = uVar26 | 0x20;
    uVar26 = (&_drawScore)[uVar26 & 1];
    goto LAB_0010a7a1;
  }
  uVar12 = this->atks[0xd] | this->atks[0xc];
  uVar24 = this->atks[10] & (uVar12 | 0x3c3c3c3c0000) |
           this->atks[4] | this->atks[2] | this->atks[6] | this->atks[8];
  uVar13 = uVar24 - (uVar24 >> 1 & 0x5555555555555555);
  uVar14 = (uVar13 & 0x3333333333333333) + (uVar13 >> 2 & 0x3333333333333333);
  uVar13 = (uVar24 & 0x1818000000) - (uVar24 >> 1 & 0x404000000);
  uVar15 = (uVar13 & 0x3333333330000000) + (uVar13 >> 2 & 0x3333333333000000);
  uVar13 = (uVar24 & uVar12) - ((uVar24 & uVar12) >> 1 & 0x5555555555555555);
  uVar25 = (uVar13 & 0x3333333333333333) + (uVar13 >> 2 & 0x3333333333333333);
  uVar13 = (uVar12 | 0x3c3c3c3c0000) & this->atks[0xb] |
           this->atks[5] | this->atks[3] | this->atks[7] | this->atks[9];
  uVar24 = uVar13 - (uVar13 >> 1 & 0x5555555555555555);
  uVar24 = (uVar24 & 0x3333333333333333) + (uVar24 >> 2 & 0x3333333333333333);
  uVar20 = (uVar13 & 0x1818000000) - (uVar13 >> 1 & 0x404000000);
  uVar20 = (uVar20 & 0x3333333330000000) + (uVar20 >> 2 & 0x3333333333000000);
  uVar13 = (uVar13 & uVar12) - ((uVar13 & uVar12) >> 1 & 0x5555555555555555);
  uVar13 = (uVar13 & 0x3333333333333333) + (uVar13 >> 2 & 0x3333333333333333);
  uVar26 = (iVar8 + (uint)(byte)(((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f000000) * 0x101010101010101 >>
                                0x38) +
            (uint)(byte)(((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
           (uint)(byte)(((uVar25 >> 4) + uVar25 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)) -
           ((uint)(byte)(((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f000000) * 0x101010101010101 >> 0x38) +
            (uint)(byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
           (uint)(byte)(((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38));
  uVar13 = this->pc[2];
  uVar24 = this->pc[4];
  uVar12 = this->pc[6];
  uVar14 = uVar12 | uVar24;
  uVar15 = (uVar14 | uVar13) & ~this->atks[0];
  if (uVar15 != 0) {
    uVar15 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
    uVar15 = (uVar15 & 0x3333333333333333) + (uVar15 >> 2 & 0x3333333333333333);
    uVar26 = uVar26 + (uint)(byte)(((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                  >> 0x38) * -6;
  }
  uVar15 = this->pc[3];
  uVar20 = this->pc[5];
  uVar25 = this->pc[7];
  uVar16 = uVar25 | uVar20;
  uVar17 = (uVar16 | uVar15) & ~this->atks[1];
  if (uVar17 != 0) {
    uVar17 = uVar17 - (uVar17 >> 1 & 0x5555555555555555);
    uVar17 = (uVar17 & 0x3333333333333333) + (uVar17 >> 2 & 0x3333333333333333);
    uVar26 = uVar26 + (uint)(byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                  >> 0x38) * 6;
  }
  if ((uVar24 & uVar24 - 1) != 0) {
    uVar17 = uVar24 - (uVar24 >> 1 & 0x5555555555555555);
    uVar17 = (uVar17 & 0x3333333333333333) + (uVar17 >> 2 & 0x3333333333333333);
    uVar26 = (uVar26 - ((uint)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x34) & 0xfffffff0)) + 0x10;
  }
  if ((uVar20 & uVar20 - 1) != 0) {
    uVar17 = uVar20 - (uVar20 >> 1 & 0x5555555555555555);
    uVar17 = (uVar17 & 0x3333333333333333) + (uVar17 >> 2 & 0x3333333333333333);
    uVar26 = (uVar26 + ((uint)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x34) & 0xfffffff0)) - 0x10;
  }
  if (uVar15 != 0 || uVar13 != 0) {
    uVar28 = this->pinfo[0].count;
    uVar17 = uVar13 - (uVar13 >> 1 & 0x5555555555555555);
    uVar17 = (uVar17 & 0x3333333333333333) + (uVar17 >> 2 & 0x3333333333333333);
    if (uVar28 != (byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))
    {
      __assert_fail("pinfo[White].count == BitCount(pc[WhitePawn])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x74a,"void bitfoot::Bitfoot::Evaluate()");
    }
    uVar10 = this->pinfo[1].count;
    uVar17 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
    uVar17 = (uVar17 & 0x3333333333333333) + (uVar17 >> 2 & 0x3333333333333333);
    if (uVar10 != (byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))
    {
      __assert_fail("pinfo[Black].count == BitCount(pc[BlackPawn])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x74b,"void bitfoot::Bitfoot::Evaluate()");
    }
    iVar7 = uVar10 + uVar28;
    if (0x10 < iVar7) {
      __assert_fail("count <= 21",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x757,"void bitfoot::Bitfoot::Evaluate()");
    }
    iVar7 = (iVar7 * 4) / 3;
    uVar17 = ~this->atks[1] & this->pinfo[0].behind;
    uVar17 = uVar17 >> 8 & uVar17;
    uVar17 = uVar17 - (uVar17 >> 1 & 0x55555555555555);
    uVar22 = (uVar17 & 0x3333333333333333) + (uVar17 >> 2 & 0x3333333333333333);
    uVar17 = ~this->atks[0] & this->pinfo[1].behind;
    uVar17 = uVar17 >> 8 & uVar17;
    uVar17 = uVar17 - (uVar17 >> 1 & 0x55555555555555);
    uVar17 = (uVar17 & 0x3333333333333333) + (uVar17 >> 2 & 0x3333333333333333);
    iVar8 = iVar7;
    if (uVar24 == 0) {
      iVar8 = 0;
    }
    iVar27 = iVar7;
    if (uVar20 == 0) {
      iVar27 = 0;
    }
    iVar19 = (iVar8 + ((uint)(((uVar22 >> 4) + uVar22 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                             0x37) & 0xfffffffe) + uVar26) -
             (iVar27 + ((uint)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x37) & 0xfffffffe));
    iVar27 = iVar7 * 4 >> 0x1f;
    iVar7 = (iVar7 * 4) / 3 + iVar27;
    iVar8 = (iVar19 - (iVar7 - iVar27)) + 0x1c;
    if (this->pc[8] == 0) {
      iVar8 = iVar19;
    }
    iVar27 = (iVar7 + -0x1c) - iVar27;
    if (this->pc[9] == 0) {
      iVar27 = 0;
    }
    uVar26 = iVar27 + iVar8;
    uVar17 = this->pinfo[0].connected << 8 & this->pinfo[1].connected;
    if (((uVar17 != 0) && (uVar17 = (~uVar17 >> 1 | 0x80808080808080ff) & uVar17, uVar17 != 0)) &&
       (uVar17 = uVar17 - (uVar17 >> 1 & 0x5555555555555500),
       uVar17 = (uVar17 & 0x3333333333333300) + (uVar17 >> 2 & 0x3333333333333300),
       uVar28 = (uint)(byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f00) * 0x101010101010101 >>
                            0x38), 2 < uVar28)) {
      iVar8 = uVar26 * (10 - uVar28);
      iVar7 = iVar8 + 7;
      if (-1 < iVar8) {
        iVar7 = iVar8;
      }
      uVar26 = iVar7 >> 3;
    }
  }
  uVar18 = this->pc[0xc] ^ this->pc[0];
  uVar22 = uVar18 ^ uVar13;
  uVar17 = this->pc[8];
  uVar11 = this->pc[10] | uVar17;
  if (uVar22 != (uVar11 | uVar14)) {
    __function = "uint64_t bitfoot::Bitfoot::MajorsAndMinors() const [color = false]";
LAB_0010ac02:
    __assert_fail("(pc[color] ^ pc[color|Pawn] ^ pc[color|King]) == (MinorPieces<color>() | MajorPieces<color>())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0x294,__function);
  }
  uVar29 = this->pc[0xd] ^ this->pc[1];
  uVar23 = uVar29 ^ uVar15;
  uVar2 = this->pc[9];
  uVar21 = this->pc[0xb] | uVar2;
  if (uVar23 != (uVar21 | uVar16)) {
    __function = "uint64_t bitfoot::Bitfoot::MajorsAndMinors() const [color = true]";
    goto LAB_0010ac02;
  }
  bVar31 = true;
  bVar30 = true;
  if (((uVar11 == 0 && uVar13 == 0) &&
      (uVar11 = uVar12 - (uVar12 >> 1 & 0x5555555555555555),
      uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333), bVar30 = true,
      (byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2)) &&
     (uVar24 == 0 || uVar12 == 0)) {
    uVar24 = uVar22 - (uVar18 >> 1 & 0x5555555555555555);
    uVar24 = (uVar24 & 0x3333333333333333) + (uVar24 >> 2 & 0x3333333333333333);
    bVar30 = 2 < (byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  if (((uVar21 == 0 && uVar15 == 0) &&
      (uVar24 = uVar25 - (uVar25 >> 1 & 0x5555555555555555),
      uVar24 = (uVar24 >> 2 & 0x3333333333333333) + (uVar24 & 0x3333333333333333),
      (byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2)) &&
     (uVar20 == 0 || uVar25 == 0)) {
    uVar24 = uVar23 - (uVar29 >> 1 & 0x5555555555555555);
    uVar24 = (uVar24 & 0x3333333333333333) + (uVar24 >> 2 & 0x3333333333333333);
    bVar31 = 2 < (byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  if (bVar30 == false && bVar31 == false) goto LAB_0010a783;
  if (((0 < (int)uVar26 & (bVar30 ^ 1U)) == 0) && (-1 < (int)uVar26 || bVar31 != false)) {
    uVar28 = uVar26;
    if (uVar15 == 0 && uVar13 == 0) {
      if (uVar18 == uVar13) goto LAB_0010a94b;
      uVar13 = uVar22 - (uVar22 >> 1 & 0x5555555555555555);
      uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
      uVar13 = ((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      if ((((uVar13 >> 0x38 < 2) && (uVar29 != uVar15)) &&
          (uVar24 = uVar23 - (uVar23 >> 1 & 0x5555555555555555),
          uVar24 = (uVar24 >> 2 & 0x3333333333333333) + (uVar24 & 0x3333333333333333),
          (byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2)) &&
         (((uVar22 == this->pc[10] && (uVar23 == uVar2)) ||
          ((uVar22 == uVar17 && (uVar23 == this->pc[0xb])))))) {
        uVar28 = uVar26 + 0x50;
        if (0 < (int)uVar26) {
          uVar28 = uVar26 - 0x50;
        }
        goto LAB_0010a7fa;
      }
      if (((((byte)(uVar13 >> 0x38) < 2) && (uVar22 == uVar17)) && (uVar23 == uVar16)) &&
         (uVar13 = uVar23 - (uVar29 >> 1 & 0x5555555555555555),
         uVar13 = (uVar13 & 0x3333333333333333) + (uVar13 >> 2 & 0x3333333333333333),
         ((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 < 0x300000000000000)) {
        uVar10 = -uVar26;
        if (0 < (int)uVar26) {
          uVar10 = uVar26;
        }
        if (0xff < uVar10) goto LAB_0010a94b;
        iVar8 = uVar10 * uVar26;
        iVar7 = iVar8 + 0xff;
        if (-1 < iVar8) {
          iVar7 = iVar8;
        }
LAB_0010ab9b:
        uVar28 = iVar7 >> 8;
      }
      else {
LAB_0010a94b:
        if (((uVar22 == uVar14) && (uVar23 == uVar2)) &&
           ((uVar29 != uVar15 &&
            ((uVar23 = uVar23 - (uVar23 >> 1 & 0x5555555555555555),
             uVar13 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333),
             (byte)(((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2 &&
             (uVar22 = uVar22 - (uVar18 >> 1 & 0x5555555555555555),
             uVar13 = (uVar22 & 0x3333333333333333) + (uVar22 >> 2 & 0x3333333333333333),
             ((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 < 0x300000000000000)))
            ))) {
          uVar10 = -uVar26;
          if (0 < (int)uVar26) {
            uVar10 = uVar26;
          }
          if (uVar10 < 0x100) {
            iVar8 = uVar10 * uVar26;
            iVar7 = iVar8 + 0xff;
            if (-1 < iVar8) {
              iVar7 = iVar8;
            }
            goto LAB_0010ab9b;
          }
        }
      }
    }
    else {
      if ((uVar22 == uVar17) && (uVar23 == uVar2)) {
        uVar10 = -uVar26;
        if (0 < (int)uVar26) {
          uVar10 = uVar26;
        }
        if (uVar10 < 0x80) {
          iVar8 = uVar10 * uVar26;
          iVar7 = iVar8 + 0x7f;
          if (-1 < iVar8) {
            iVar7 = iVar8;
          }
          uVar28 = iVar7 >> 7;
          goto LAB_0010a7fa;
        }
      }
      if ((uVar22 == uVar12) && (uVar23 == uVar25)) {
        if ((uVar18 != uVar13) &&
           (((uVar22 & 0xaa55aa55aa55aa55) == 0) != ((uVar23 & 0xaa55aa55aa55aa55) == 0))) {
          uVar10 = -uVar26;
          if (0 < (int)uVar26) {
            uVar10 = uVar26;
          }
          if (((((uVar22 & uVar22 - 1) == 0) && (uVar29 != uVar15)) &&
              (uVar23 = uVar23 - (uVar23 >> 1 & 0x5555555555555555),
              uVar13 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333),
              (byte)(((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2))
             && (uVar10 < 300)) {
            if ((int)uVar26 < 1) {
              uVar3 = this->pinfo[1].connected;
            }
            else {
              uVar3 = this->pinfo[0].connected;
            }
            if (uVar3 == 0) {
              uVar26 = (int)uVar26 / 3;
            }
            uVar28 = -uVar26;
            if (0 < (int)uVar26) {
              uVar28 = uVar26;
            }
            uVar28 = (int)(uVar28 * uVar26) / 300;
          }
        }
      }
    }
  }
  else {
    if (bVar30 == bVar31) {
      __assert_fail("whiteCanWin != blackCanWin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x786,"void bitfoot::Bitfoot::Evaluate()");
    }
    uVar28 = -uVar26;
    if (0 < (int)uVar26) {
      uVar28 = uVar26;
    }
    if (999 < uVar28) {
      __assert_fail("abs(eval) < 1000",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x787,"void bitfoot::Bitfoot::Evaluate()");
    }
    iVar8 = (int)(uVar28 * uVar26) >> 0x1f;
    iVar7 = (int)(uVar28 * uVar26) / 1000 + iVar8;
    uVar28 = (iVar7 + -0x32) - iVar8;
    if (bVar30 != false) {
      uVar28 = (iVar7 + 0x32) - iVar8;
    }
  }
LAB_0010a7fa:
  uVar26 = -uVar28;
  if (0 < (int)uVar28) {
    uVar26 = uVar28;
  }
  if ((0x19 < this->rcount) && (8 < uVar26)) {
    uVar28 = (uint)((25.0 / (double)this->rcount) * (double)(int)uVar28);
  }
  uVar26 = -uVar28;
  if ((this->state & 1) == 0) {
    uVar26 = uVar28;
  }
LAB_0010a7a1:
  this->standPat = uVar26;
  return;
}

Assistant:

void Evaluate() {
#ifndef NDEBUG
    assert(!(state & Draw));
    memset(&evals, 0, sizeof(evals));
#endif
    memset(pinfo, 0, sizeof(pinfo));
    memset(atks, 0, sizeof(atks));
    atkCount[White] = 0;
    atkCount[Black] = 0;
    atkScore[White] = 0;
    atkScore[Black] = 0;

    // evaluate from white's perspective
    int eval = ((ColorToMove() ? -_tempo : _tempo) +
                material[White] -
                material[Black] +
                sqrVal[White] -
                sqrVal[Black] +
                GetPins<Black>(6) -
                GetPins<White>(6));

    // no pawns = bad
    if (pc[WhitePawn])   eval += PawnEval<White>(); else eval -= 50;
    if (pc[BlackPawn])   eval -= PawnEval<Black>(); else eval += 50;
    if (pc[WhiteKnight]) eval += KnightEval<White>();
    if (pc[BlackKnight]) eval -= KnightEval<Black>();
    if (pc[WhiteBishop]) eval += BishopEval<White>();
    if (pc[BlackBishop]) eval -= BishopEval<Black>();
    if (pc[WhiteRook])   eval += RookEval<White>();
    if (pc[BlackRook])   eval -= RookEval<Black>();
    if (pc[WhiteQueen])  eval += QueenEval<White>();
    if (pc[BlackQueen])  eval -= QueenEval<Black>();

    // fill in attack bitmaps sans king attacks
    atks[White] = (atks[WhitePawn] | atks[WhiteKnight] | atks[WhiteBishop] |
                   atks[WhiteRook] | atks[WhiteQueen]);
    atks[Black] = (atks[BlackPawn] | atks[BlackKnight] | atks[BlackBishop] |
                   atks[BlackRook] | atks[BlackQueen]);

    eval += KingEval<White>();
    eval -= KingEval<Black>();

    // finish populating attack bitmaps
    atks[WhiteKing] = _KING_ATK[king[White]];
    atks[BlackKing] = _KING_ATK[king[Black]];
    atks[White] = (atks[WhitePawn] | atks[WhiteKnight] | atks[WhiteBishop] |
                   atks[WhiteRook] | atks[WhiteQueen]  | atks[WhiteKing]);
    atks[Black] = (atks[BlackPawn] | atks[BlackKnight] | atks[BlackBishop] |
                   atks[BlackRook] | atks[BlackQueen]  | atks[BlackKing]);

    // now that attack bitmaps are complete evaluate passed pawns
    if (pinfo[White].passed) eval += PasserEval<White>();
    if (pinfo[Black].passed) eval -= PasserEval<Black>();

#ifndef NDEBUG
    VerifyPosition();
#endif

    // NOTE: if draw due to rcount this destabilizes the transposition table
    //       because rcount is not encoded into positionKey
    if (IsDraw()) {
      state |= Draw;
      standPat = _drawScore[ColorToMove()];
      return;
    }

    // TODO use specialized eval function for particular piece configurations

    // bonus for board coverage
    uint64_t x;
    x = (atks[WhitePawn]|atks[WhiteKnight]|atks[WhiteBishop]|atks[WhiteRook]|
         (atks[WhiteQueen] & (_CENTER16|atks[WhiteKing]|atks[BlackKing])));
    eval += (BitCount(x) + BitCount(x & _CENTER4) +
             BitCount(x & (atks[WhiteKing]|atks[BlackKing])));
    x = (atks[BlackPawn]|atks[BlackKnight]|atks[BlackBishop]|atks[BlackRook]|
         (atks[BlackQueen] & (_CENTER16|atks[WhiteKing]|atks[BlackKing])));
    eval -= (BitCount(x) + BitCount(x & _CENTER4) +
             BitCount(x & (atks[WhiteKing]|atks[BlackKing])));

    // penalty for unprotected pawns, knights, and bishops
    if ((x = ((pc[WhitePawn]|MinorPieces<White>()) & ~atks[White]))) {
      eval -= (6 * BitCount(x));
    }
    if ((x = ((pc[BlackPawn]|MinorPieces<Black>()) & ~atks[Black]))) {
      eval += (6 * BitCount(x));
    }

    // redundant knights are worth slightly less
    if (MULTI_BIT(pc[WhiteKnight])) {
      eval -= (16 * (BitCount(pc[WhiteKnight]) - 1));
    }
    if (MULTI_BIT(pc[BlackKnight])) {
      eval += (16 * (BitCount(pc[BlackKnight]) - 1));
    }

    // are there any pawns on the board?
    if (pc[WhitePawn] || pc[BlackPawn]) {
      assert(pinfo[White].count == BitCount(pc[WhitePawn]));
      assert(pinfo[Black].count == BitCount(pc[BlackPawn]));

      // bonus for uncontested contiguous vertical space behind connected pawns
      x = (pinfo[White].behind & ~atks[Black]);
      x &= (x >> 8);
      eval += (2 * BitCount(x));
      x = (pinfo[Black].behind & ~atks[White]);
      x &= (x >> 8);
      eval -= (2 * BitCount(x));

      // increase value of 1 knight relative to # of pawns on the board
      int count = ((4 * (pinfo[White].count + pinfo[Black].count)) / 3);
      assert(count <= 21);
      if (pc[WhiteKnight]) {
        eval += count;
      }
      if (pc[BlackKnight]) {
        eval -= count;
      }

      // increase value of 1 rook as pawns come off the board
      count = ((4 * count) / 3); // inflate pawn count a bit more
      assert(count <= 28);
      if (pc[WhiteRook]) {
        eval += (28 - count);
      }
      if (pc[BlackRook]) {
        eval -= (28 - count);
      }

      // reduce winning score relative to number of locked pawns
      if ((x = ((pinfo[White].connected << North) & pinfo[Black].connected))) {
        if ((x &= ~((x & ~_FILE[0]) >> 1))) {
          if ((count = BitCount(x)) > 2) {
            eval = ((eval * (10 - count)) / 8);
          }
        }
      }
    }

    // draw due to lack of mating material?
    const uint64_t whitePcs = MajorsAndMinors<White>();
    const uint64_t blackPcs = MajorsAndMinors<Black>();
    const bool whiteCanWin  = (pc[WhitePawn] || pc[WhiteRook] ||
                               pc[WhiteQueen] || MULTI_BIT(pc[WhiteBishop]) ||
                               (pc[WhiteKnight] && pc[WhiteBishop]) ||
                               (BitCount(whitePcs) > 2));
    const bool blackCanWin  = (pc[BlackPawn] || pc[BlackRook] ||
                               pc[BlackQueen] || MULTI_BIT(pc[BlackBishop]) ||
                               (pc[BlackKnight] && pc[BlackBishop]) ||
                               (BitCount(blackPcs) > 2));
    if (!whiteCanWin && !blackCanWin) {
      state |= Draw;
      standPat = _drawScore[ColorToMove()];
      return;
    }

    // reduce winning score if "winning" side can't win
    if (((eval > 0) && !whiteCanWin) || ((eval < 0) && !blackCanWin)) {
      assert(whiteCanWin != blackCanWin);
      assert(abs(eval) < 1000);
      eval = ((eval * abs(eval)) / 1000);
      eval += (whiteCanWin ? 50 : -50);
    }

    else if (!pc[WhitePawn] && !pc[BlackPawn]) {
      // reduce winning score if Q vs R
      if (SINGLE_BIT(whitePcs) && SINGLE_BIT(blackPcs) &&
          (((whitePcs == pc[WhiteQueen]) && (blackPcs == pc[BlackRook])) ||
           ((blackPcs == pc[BlackQueen]) && (whitePcs == pc[WhiteRook]))))
      {
        eval -= ((eval > 0) ? 80 : -80);
      }

      // reduce winning score if R vs minor(s)
      else if (SINGLE_BIT(whitePcs) && (whitePcs == pc[WhiteRook]) &&
               (blackPcs == MinorPieces<Black>()) &&
               (BitCount(blackPcs) <= 2) && (abs(eval) < 256))
      {
        eval = ((eval * abs(eval)) / 256);
      }
      else if (SINGLE_BIT(blackPcs) && (blackPcs == pc[BlackRook]) &&
               (whitePcs == MinorPieces<White>()) &&
               (BitCount(whitePcs) <= 2) && (abs(eval) < 256))
      {
        eval = ((eval * abs(eval)) / 256);
      }
    }

    // reduce winning score if pawns + R vs R ending
    else if ((whitePcs == pc[WhiteRook]) && (blackPcs == pc[BlackRook]) &&
             (abs(eval) < 128))
    {
      eval = ((eval * abs(eval)) / 128);
    }

    // reduce winning score if pawns + opposite color bishop ending
    else if ((whitePcs == pc[WhiteBishop]) && (blackPcs == pc[BlackBishop]) &&
             (!(whitePcs & _LIGHT) != !(blackPcs & _LIGHT)) &&
             SINGLE_BIT(whitePcs) && SINGLE_BIT(blackPcs) &&
             (abs(eval) < 300))
    {
      if ((eval > 0) ? !pinfo[White].connected : !pinfo[Black].connected) {
        eval /= 3;
      }
      eval = ((eval * abs(eval)) / 300);
    }

    // reduce winning score if rcount is getting large
    // NOTE: this destabilizes transposition table values
    //       because rcount is not encoded into positionKey
    if ((rcount > 25) && (abs(eval) > 8)) {
      eval = static_cast<int>(eval * (25.0 / rcount));
    }

    // standPat is eval from persepctive of the side to move
    standPat = (ColorToMove() ? -eval : eval);
  }